

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::DictionaryFeatureType::_InternalSerialize
          (DictionaryFeatureType *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  ulong uVar3;
  
  uVar2 = this->_oneof_case_[0];
  if (uVar2 == 1) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::Int64FeatureType>
                       (1,(this->KeyType_).int64keytype_,puVar1,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 2) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::StringFeatureType>
                       (2,(this->KeyType_).stringkeytype_,puVar1,stream);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) == 0) {
    return target;
  }
  uVar3 = uVar3 & 0xfffffffffffffffc;
  puVar1 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar3 + 8),*(int *)(uVar3 + 0x10),target);
  return puVar1;
}

Assistant:

uint8_t* DictionaryFeatureType::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.DictionaryFeatureType)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Int64FeatureType int64KeyType = 1;
  if (_internal_has_int64keytype()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::int64keytype(this), target, stream);
  }

  // .CoreML.Specification.StringFeatureType stringKeyType = 2;
  if (_internal_has_stringkeytype()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::stringkeytype(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.DictionaryFeatureType)
  return target;
}